

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::repaint(QWidget *this,int x,int y,int w,int h)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QRect *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((in_ESI <= iVar2) &&
     (iVar2 = QRect::height((QRect *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8)), in_EDX <= iVar2))
  {
    if (in_ECX < 0) {
      QRect::width((QRect *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
    }
    if (in_R8D < 0) {
      QRect::height((QRect *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
    }
    QRect::QRect((QRect *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI,in_EDX,in_stack_ffffffffffffffb8);
    repaint((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::repaint(int x, int y, int w, int h)
{
    if (x > data->crect.width() || y > data->crect.height())
        return;

    if (w < 0)
        w = data->crect.width()  - x;
    if (h < 0)
        h = data->crect.height() - y;

    repaint(QRect(x, y, w, h));
}